

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::load_fromMPS(HModel *this,char *filename)

{
  int iVar1;
  reference pvVar2;
  HTimer *this_00;
  char *in_RSI;
  long in_RDI;
  HModel *this_01;
  double dVar3;
  int c_n;
  int numIntegerColumn;
  int RtCd;
  int mxNumCol;
  int mxNumRow;
  int *in_stack_000001e8;
  int *in_stack_000001f0;
  int *in_stack_000001f8;
  int in_stack_00000200;
  int in_stack_00000204;
  char *in_stack_00000208;
  double *in_stack_00000220;
  vector<int,_std::allocator<int>_> *in_stack_00000228;
  vector<int,_std::allocator<int>_> *in_stack_00000230;
  vector<double,_std::allocator<double>_> *in_stack_00000238;
  vector<double,_std::allocator<double>_> *in_stack_00000240;
  vector<double,_std::allocator<double>_> *in_stack_00000248;
  vector<double,_std::allocator<double>_> *in_stack_00000250;
  vector<double,_std::allocator<double>_> *in_stack_00000258;
  vector<double,_std::allocator<double>_> *in_stack_00000260;
  vector<int,_std::allocator<int>_> *in_stack_00000268;
  HModel *in_stack_ffffffffffffff40;
  int local_5c;
  uint local_58;
  
  clearModel(in_stack_ffffffffffffff40);
  *(undefined8 *)(in_RDI + 0x568) = 0;
  HTimer::reset((HTimer *)in_stack_ffffffffffffff40);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x628),in_RSI);
  this_00 = (HTimer *)(in_RDI + 0x648);
  this_01 = (HModel *)(in_RDI + 0x678);
  iVar1 = readMPS(in_stack_00000208,in_stack_00000204,in_stack_00000200,in_stack_000001f8,
                  in_stack_000001f0,in_stack_000001e8,in_stack_00000220,in_stack_00000228,
                  in_stack_00000230,in_stack_00000238,in_stack_00000240,in_stack_00000248,
                  in_stack_00000250,in_stack_00000258,in_stack_00000260,in_stack_00000268);
  if (iVar1 == 0) {
    local_58 = 0;
    for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x60c); local_5c = local_5c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x738),(long)local_5c);
      if (*pvVar2 != 0) {
        local_58 = local_58 + 1;
      }
    }
    if (local_58 != 0) {
      printf("MPS file has %d integer variables\n",(ulong)local_58);
    }
    *(int *)(in_RDI + 0x614) = *(int *)(in_RDI + 0x60c) + *(int *)(in_RDI + 0x610);
    initScale(this_01);
    initWithLogicalBasis(this_01);
    dVar3 = HTimer::getTime(this_00);
    *(double *)(in_RDI + 0x568) = dVar3 + *(double *)(in_RDI + 0x568);
  }
  else {
    dVar3 = HTimer::getTime(this_00);
    *(double *)(in_RDI + 0x568) = dVar3 + *(double *)(in_RDI + 0x568);
  }
  return iVar1;
}

Assistant:

int HModel::load_fromMPS(const char *filename) {
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  //setup_loadMPS(filename);

  int mxNumRow = -1;
  int mxNumCol = -1;
  int RtCd = readMPS(filename, mxNumRow, mxNumCol,
		     numRow, numCol, objSense, objOffset,
		     Astart,  Aindex, Avalue,
		     colCost, colLower, colUpper, rowLower, rowUpper,
		     integerColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }

#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}